

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::processCallback(Process *this,int fd,int mode)

{
  int mode_local;
  int fd_local;
  Process *this_local;
  
  if (mode != 8) {
    if (fd == this->mStdIn[1]) {
      handleInput(this,fd);
    }
    else if (fd == this->mStdOut[0]) {
      handleOutput(this,fd,&this->mStdOutBuffer,&this->mStdOutIndex,&this->mReadyReadStdOut);
    }
    else if (fd == this->mStdErr[0]) {
      handleOutput(this,fd,&this->mStdErrBuffer,&this->mStdErrIndex,&this->mReadyReadStdErr);
    }
  }
  return;
}

Assistant:

void Process::processCallback(int fd, int mode)
{
    if (mode == EventLoop::SocketError) {
        // we're closed, shut down
        return;
    }
    if (fd == mStdIn[1])
        handleInput(fd);
    else if (fd == mStdOut[0])
        handleOutput(fd, mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
    else if (fd == mStdErr[0])
        handleOutput(fd, mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
}